

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O2

void cmGetCMakeInputs(cmGlobalGenerator *gg,string *sourceDir,string *buildDir,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *internalFiles,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *explicitFiles,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *tmpFiles)

{
  pointer ppcVar1;
  string *psVar2;
  __type _Var3;
  string *psVar4;
  pointer ppcVar5;
  long lVar6;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  bool bVar7;
  string local_b0;
  string cmakeRootDir;
  string toAdd;
  string startOfFile;
  
  psVar4 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::operator+(&cmakeRootDir,psVar4,'/');
  ppcVar1 = (gg->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar5 = (gg->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppcVar5 != ppcVar1; ppcVar5 = ppcVar5 + 1
      ) {
    psVar2 = ((*ppcVar5)->ListFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar4 = ((*ppcVar5)->ListFiles).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar2; psVar4 = psVar4 + 1)
    {
      std::__cxx11::string::substr((ulong)&startOfFile,(ulong)psVar4);
      _Var3 = std::operator==(&startOfFile,&cmakeRootDir);
      if (_Var3) {
        bVar7 = false;
      }
      else {
        std::operator+(&toAdd,buildDir,'/');
        lVar6 = std::__cxx11::string::find((string *)psVar4,(ulong)&toAdd);
        bVar7 = lVar6 == 0;
        std::__cxx11::string::~string((string *)&toAdd);
      }
      std::__cxx11::string::string((string *)&toAdd,(string *)psVar4);
      if (sourceDir->_M_string_length != 0) {
        cmSystemTools::RelativePath(&local_b0,sourceDir,psVar4);
        if (local_b0._M_string_length < toAdd._M_string_length) {
          std::__cxx11::string::_M_assign((string *)&toAdd);
        }
        std::__cxx11::string::~string((string *)&local_b0);
      }
      this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)internalFiles;
      if ((!_Var3) &&
         (this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)explicitFiles,
         bVar7)) {
        this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)tmpFiles;
      }
      if (this != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(this,&toAdd);
      }
      std::__cxx11::string::~string((string *)&toAdd);
      std::__cxx11::string::~string((string *)&startOfFile);
    }
  }
  std::__cxx11::string::~string((string *)&cmakeRootDir);
  return;
}

Assistant:

void cmGetCMakeInputs(const cmGlobalGenerator* gg,
                      const std::string& sourceDir,
                      const std::string& buildDir,
                      std::vector<std::string>* internalFiles,
                      std::vector<std::string>* explicitFiles,
                      std::vector<std::string>* tmpFiles)
{
  const std::string cmakeRootDir = cmSystemTools::GetCMakeRoot() + '/';
  std::vector<cmMakefile*> const& makefiles = gg->GetMakefiles();
  for (cmMakefile const* mf : makefiles) {
    for (std::string const& lf : mf->GetListFiles()) {

      const std::string startOfFile = lf.substr(0, cmakeRootDir.size());
      const bool isInternal = (startOfFile == cmakeRootDir);
      const bool isTemporary = !isInternal && (lf.find(buildDir + '/') == 0);

      std::string toAdd = lf;
      if (!sourceDir.empty()) {
        const std::string& relative =
          cmSystemTools::RelativePath(sourceDir, lf);
        if (toAdd.size() > relative.size()) {
          toAdd = relative;
        }
      }

      if (isInternal) {
        if (internalFiles) {
          internalFiles->push_back(std::move(toAdd));
        }
      } else {
        if (isTemporary) {
          if (tmpFiles) {
            tmpFiles->push_back(std::move(toAdd));
          }
        } else {
          if (explicitFiles) {
            explicitFiles->push_back(std::move(toAdd));
          }
        }
      }
    }
  }
}